

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  CidrRange *pCVar1;
  RemoveConst<kj::_::CidrRange> *pRVar2;
  NetworkFilter *pNVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  CidrRange *cidr;
  CidrRange *pCVar8;
  uint uVar9;
  ArrayPtr<const_char> AVar10;
  Fault f;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (addrlen < 2) {
    local_50.exception = (Exception *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    Debug::Fault::init(&local_50,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                      );
    Debug::Fault::fatal(&local_50);
  }
  if (addr->sa_family == 1) {
    AVar10 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar10.size_ == 0) || (*AVar10.ptr != '\0')) {
      lVar7 = 0x48;
    }
    else {
      lVar7 = 0x49;
    }
    uVar9 = (uint)*(byte *)((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lVar7);
  }
  else {
    pCVar8 = (this->allowCidrs).builder.ptr;
    pCVar1 = (this->allowCidrs).builder.pos;
    uVar9 = 0;
    if (pCVar8 != pCVar1) {
      bVar5 = false;
      do {
        bVar4 = CidrRange::matches(pCVar8,addr);
        if (bVar4) {
          if (uVar9 <= pCVar8->bitCount) {
            uVar9 = pCVar8->bitCount;
          }
          bVar5 = true;
        }
        pCVar8 = pCVar8 + 1;
      } while (pCVar8 != pCVar1);
      if (bVar5) {
        pRVar2 = (this->denyCidrs).builder.pos;
        for (pCVar8 = (this->denyCidrs).builder.ptr; pCVar8 != pRVar2; pCVar8 = pCVar8 + 1) {
          bVar5 = CidrRange::matches(pCVar8,addr);
          if ((bVar5) && (uVar9 <= pCVar8->bitCount)) goto LAB_003053c1;
        }
        pNVar3 = (this->next).ptr;
        if (pNVar3 != (NetworkFilter *)0x0) {
          iVar6 = (**(pNVar3->super_NetworkFilter)._vptr_NetworkFilter)(pNVar3,addr,(ulong)addrlen);
          return SUB41(iVar6,0);
        }
        uVar9 = 1;
      }
      else {
LAB_003053c1:
        uVar9 = 0;
      }
    }
  }
  return SUB41(uVar9,0);
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;
  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_MAYBE(n, next) {
    return n->shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}